

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O2

bool __thiscall test_CECoordinates::test_ConvertTo(test_CECoordinates *this)

{
  CECoordinates *this_00;
  undefined1 uVar1;
  double date_00;
  allocator local_1ed;
  undefined4 local_1ec;
  undefined4 local_1e8 [8];
  CECoordinates test_obs;
  CECoordinates test_gal;
  CECoordinates test_cirs;
  CEDate date;
  CECoordinates test_icrs;
  CEObserver observer;
  
  date._vptr_CEDate = (_func_int **)0x0;
  test_icrs._vptr_CECoordinates = (_func_int **)0x0;
  test_cirs._vptr_CECoordinates = (_func_int **)0x0;
  test_gal._vptr_CECoordinates._0_4_ = 0;
  CEObserver::CEObserver
            (&observer,(double *)&date,(double *)&test_icrs,(double *)&test_cirs,
             (CEAngleType *)&test_gal);
  date._vptr_CEDate = (_func_int **)0x0;
  CEObserver::SetTemperature_C(&observer,(double *)&date);
  date._vptr_CEDate = (_func_int **)0x0;
  CEObserver::SetPressure_hPa(&observer,(double *)&date);
  date._vptr_CEDate = (_func_int **)0x0;
  CEObserver::SetWavelength_um(&observer,(double *)&date);
  date._vptr_CEDate = (_func_int **)0x0;
  CEObserver::SetRelativeHumidity(&observer,(double *)&date);
  date_00 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&date,date_00,JD);
  this_00 = &this->base_icrs_;
  CECoordinates::ConvertTo(&test_icrs,this_00,ICRS,&observer,&date);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&test_cirs,"test_ConvertTo",(allocator *)&test_obs);
  test_gal._vptr_CECoordinates._0_4_ = 0x24e;
  (**(code **)(*(long *)this + 200))(this,&test_icrs,this_00,&test_cirs);
  std::__cxx11::string::~string((string *)&test_cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test_obs);
  CECoordinates::ConvertTo(&test_cirs,this_00,CIRS,&observer,&date);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&test_gal,"test_ConvertTo",(allocator *)local_1e8);
  test_obs._vptr_CECoordinates._0_4_ = 0x251;
  (**(code **)(*(long *)this + 200))(this,&test_cirs,&this->base_cirs_,&test_gal);
  std::__cxx11::string::~string((string *)&test_gal);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_1e8);
  CECoordinates::ConvertTo(&test_gal,this_00,GALACTIC,&observer,&date);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&test_obs,"test_ConvertTo",(allocator *)&local_1ec);
  local_1e8[0] = 0x254;
  (**(code **)(*(long *)this + 200))(this,&test_gal,&this->base_gal_,&test_obs);
  std::__cxx11::string::~string((string *)&test_obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1ec);
  CECoordinates::ConvertTo(&test_obs,this_00,OBSERVED,&observer,&date);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1e8,"test_ConvertTo",&local_1ed);
  local_1ec = 599;
  (**(code **)(*(long *)this + 200))(this,&test_obs,&this->base_obs_,local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1ed);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CECoordinates::~CECoordinates(&test_obs);
  CECoordinates::~CECoordinates(&test_gal);
  CECoordinates::~CECoordinates(&test_cirs);
  CECoordinates::~CECoordinates(&test_icrs);
  CEDate::~CEDate(&date);
  CEObserver::~CEObserver(&observer);
  return (bool)uVar1;
}

Assistant:

bool test_CECoordinates::test_ConvertTo(void)
{
    // Create an observer object
    CEObserver observer(0.0, 0.0, 0.0, CEAngleType::DEGREES);
    observer.SetTemperature_C(0.0);
    observer.SetPressure_hPa(0.0);
    observer.SetWavelength_um(0.0);
    observer.SetRelativeHumidity(0.0);

    // Create a date object
    CEDate date(CppEphem::julian_date_J2000(), CEDateType::JD);

    /* ---------------------------*
     * ConvertTo basic form
     * ---------------------------*/
    CECoordinates test_icrs = base_icrs_.ConvertTo(CECoordinateType::ICRS,
                                                   observer, date);
    test_coords(test_icrs, base_icrs_, __func__, __LINE__);
    CECoordinates test_cirs = base_icrs_.ConvertTo(CECoordinateType::CIRS,
                                                   observer, date);
    test_coords(test_cirs, base_cirs_, __func__, __LINE__);
    CECoordinates test_gal = base_icrs_.ConvertTo(CECoordinateType::GALACTIC,
                                                  observer, date);
    test_coords(test_gal, base_gal_, __func__, __LINE__);
    CECoordinates test_obs = base_icrs_.ConvertTo(CECoordinateType::OBSERVED,
                                                  observer, date);
    test_coords(test_obs, base_obs_, __func__, __LINE__);

    return pass();
}